

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__decode_uint8_linear_scaled(float *decodep,int width_times_channels,void *inputp)

{
  float *pfVar1;
  undefined1 (*pauVar2) [16];
  float *pfVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [15];
  undefined1 auVar6 [14];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [14];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  undefined1 auVar13 [13];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  unkuint9 Var19;
  undefined1 auVar20 [11];
  undefined1 auVar21 [14];
  undefined1 auVar22 [13];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  uint6 uVar25;
  undefined1 (*pauVar26) [16];
  float *decode;
  float *pfVar27;
  uint uVar28;
  
  pfVar3 = decodep + width_times_channels;
  if (width_times_channels < 0x10) {
    if (3 < width_times_channels) {
      do {
        pfVar1 = decodep + 4;
        *decodep = (float)*inputp * 0.003921569;
        decodep[1] = (float)*(byte *)((long)inputp + 1) * 0.003921569;
        decodep[2] = (float)*(byte *)((long)inputp + 2) * 0.003921569;
        decodep[3] = (float)*(byte *)((long)inputp + 3) * 0.003921569;
        inputp = (void *)((long)inputp + 4);
        pfVar27 = decodep + 8;
        decodep = pfVar1;
      } while (pfVar27 <= pfVar3);
    }
    for (; decodep < pfVar3; decodep = decodep + 1) {
      *decodep = (float)*inputp * 0.003921569;
      inputp = (void *)((long)inputp + 1);
    }
  }
  else {
    pauVar26 = (undefined1 (*) [16])((long)inputp + (long)width_times_channels + -0x10);
    do {
      pfVar1 = decodep + 0x10;
      pauVar2 = (undefined1 (*) [16])((long)inputp + 0x10);
      auVar4 = *inputp;
      inputp = pauVar26;
      if (pfVar1 == pfVar3) {
        inputp = pauVar2;
      }
      auVar5[0xd] = 0;
      auVar5._0_13_ = auVar4._0_13_;
      auVar5[0xe] = auVar4[7];
      auVar7[0xc] = auVar4[6];
      auVar7._0_12_ = auVar4._0_12_;
      auVar7._13_2_ = auVar5._13_2_;
      auVar8[0xb] = 0;
      auVar8._0_11_ = auVar4._0_11_;
      auVar8._12_3_ = auVar7._12_3_;
      uVar28 = auVar8._11_4_;
      auVar9[10] = auVar4[5];
      auVar9._0_10_ = auVar4._0_10_;
      auVar9._11_4_ = uVar28;
      auVar14[9] = 0;
      auVar14._0_9_ = auVar4._0_9_;
      auVar14._10_5_ = auVar9._10_5_;
      auVar15[8] = auVar4[4];
      auVar15._0_8_ = auVar4._0_8_;
      auVar15._9_6_ = auVar14._9_6_;
      auVar18._7_8_ = 0;
      auVar18._0_7_ = auVar15._8_7_;
      Var19 = CONCAT81(SUB158(auVar18 << 0x40,7),auVar4[3]);
      auVar23._9_6_ = 0;
      auVar23._0_9_ = Var19;
      auVar20._1_10_ = SUB1510(auVar23 << 0x30,5);
      auVar20[0] = auVar4[2];
      auVar24._11_4_ = 0;
      auVar24._0_11_ = auVar20;
      auVar16[2] = auVar4[1];
      auVar16._0_2_ = auVar4._0_2_;
      auVar16._3_12_ = SUB1512(auVar24 << 0x20,3);
      auVar17._2_13_ = auVar16._2_13_;
      auVar17._0_2_ = auVar4._0_2_ & 0xff;
      auVar6._10_2_ = 0;
      auVar6._0_10_ = auVar17._0_10_;
      auVar6._12_2_ = (short)Var19;
      uVar25 = CONCAT42(auVar6._10_4_,auVar20._0_2_);
      auVar21._6_8_ = 0;
      auVar21._0_6_ = uVar25;
      auVar10._4_2_ = auVar16._2_2_;
      auVar10._0_4_ = auVar17._0_4_;
      auVar10._6_8_ = SUB148(auVar21 << 0x40,6);
      *decodep = (float)(auVar17._0_4_ & 0xffff) * 0.003921569;
      decodep[1] = (float)auVar10._4_4_ * 0.003921569;
      decodep[2] = (float)(int)uVar25 * 0.003921569;
      decodep[3] = (float)(auVar6._10_4_ >> 0x10) * 0.003921569;
      decodep[4] = (float)auVar15._8_2_ * 0.003921569;
      decodep[5] = (float)auVar9._10_2_ * 0.003921569;
      decodep[6] = (float)(uVar28 >> 8 & 0xffff) * 0.003921569;
      decodep[7] = (float)(uVar28 >> 0x18) * 0.003921569;
      pfVar27 = pfVar3 + -0x10;
      if (pfVar1 == pfVar3) {
        pfVar27 = pfVar1;
      }
      if (pfVar1 <= pfVar3 + -0x10) {
        pfVar27 = pfVar1;
        inputp = pauVar2;
      }
      uVar28 = CONCAT13(0,CONCAT12(auVar4[9],(ushort)auVar4[8]));
      auVar11[0xc] = auVar4[0xb];
      auVar11._0_12_ = ZEXT112(auVar4[0xc]) << 0x40;
      auVar12._10_3_ = auVar11._10_3_;
      auVar12._0_10_ = (unkuint10)auVar4[10] << 0x40;
      auVar22._5_8_ = 0;
      auVar22._0_5_ = auVar12._8_5_;
      auVar13[4] = auVar4[9];
      auVar13._0_4_ = uVar28;
      auVar13[5] = 0;
      auVar13._6_7_ = SUB137(auVar22 << 0x40,6);
      decodep[8] = (float)(uVar28 & 0xffff) * 0.003921569;
      decodep[9] = (float)auVar13._4_4_ * 0.003921569;
      decodep[10] = (float)auVar12._8_4_ * 0.003921569;
      decodep[0xb] = (float)(uint3)(auVar11._10_3_ >> 0x10) * 0.003921569;
      decodep[0xc] = (float)auVar4[0xc] * 0.003921569;
      decodep[0xd] = (float)auVar4[0xd] * 0.003921569;
      decodep[0xe] = (float)auVar4[0xe] * 0.003921569;
      decodep[0xf] = (float)auVar4[0xf] * 0.003921569;
      decodep = pfVar27;
    } while (pfVar1 != pfVar3);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__decode_uint8_linear_scaled )( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float * decode_end = (float*) decode + width_times_channels;
  unsigned char const * input = (unsigned char const*)inputp;

  #ifdef STBIR_SIMD
  unsigned char const * end_input_m16 = input + width_times_channels - 16;
  if ( width_times_channels >= 16 )
  {
    decode_end -= 16;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      #ifdef STBIR_SIMD8
      stbir__simdi i; stbir__simdi8 o0,o1;
      stbir__simdf8 of0, of1;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi8_expand_u8_to_u32( o0, o1, i );
      stbir__simdi8_convert_i32_to_float( of0, o0 );
      stbir__simdi8_convert_i32_to_float( of1, o1 );
      stbir__simdf8_mult( of0, of0, STBIR_max_uint8_as_float_inverted8);
      stbir__simdf8_mult( of1, of1, STBIR_max_uint8_as_float_inverted8);
      stbir__decode_simdf8_flip( of0 );
      stbir__decode_simdf8_flip( of1 );
      stbir__simdf8_store( decode + 0, of0 );
      stbir__simdf8_store( decode + 8, of1 );
      #else
      stbir__simdi i, o0, o1, o2, o3;
      stbir__simdf of0, of1, of2, of3;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi_expand_u8_to_u32( o0,o1,o2,o3,i);
      stbir__simdi_convert_i32_to_float( of0, o0 );
      stbir__simdi_convert_i32_to_float( of1, o1 );
      stbir__simdi_convert_i32_to_float( of2, o2 );
      stbir__simdi_convert_i32_to_float( of3, o3 );
      stbir__simdf_mult( of0, of0, STBIR__CONSTF(STBIR_max_uint8_as_float_inverted) );
      stbir__simdf_mult( of1, of1, STBIR__CONSTF(STBIR_max_uint8_as_float_inverted) );
      stbir__simdf_mult( of2, of2, STBIR__CONSTF(STBIR_max_uint8_as_float_inverted) );
      stbir__simdf_mult( of3, of3, STBIR__CONSTF(STBIR_max_uint8_as_float_inverted) );
      stbir__decode_simdf4_flip( of0 );
      stbir__decode_simdf4_flip( of1 );
      stbir__decode_simdf4_flip( of2 );
      stbir__decode_simdf4_flip( of3 );
      stbir__simdf_store( decode + 0,  of0 );
      stbir__simdf_store( decode + 4,  of1 );
      stbir__simdf_store( decode + 8,  of2 );
      stbir__simdf_store( decode + 12, of3 );
      #endif
      decode += 16;
      input += 16;
      if ( decode <= decode_end )
        continue;
      if ( decode == ( decode_end + 16 ) )
        break;
      decode = decode_end; // backup and do last couple
      input = end_input_m16;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode <= decode_end )
  {
    STBIR_SIMD_NO_UNROLL(decode);
    decode[0-4] = ((float)(input[stbir__decode_order0])) * stbir__max_uint8_as_float_inverted;
    decode[1-4] = ((float)(input[stbir__decode_order1])) * stbir__max_uint8_as_float_inverted;
    decode[2-4] = ((float)(input[stbir__decode_order2])) * stbir__max_uint8_as_float_inverted;
    decode[3-4] = ((float)(input[stbir__decode_order3])) * stbir__max_uint8_as_float_inverted;
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = ((float)(input[stbir__decode_order0])) * stbir__max_uint8_as_float_inverted;
    #if stbir__coder_min_num >= 2
    decode[1] = ((float)(input[stbir__decode_order1])) * stbir__max_uint8_as_float_inverted;
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = ((float)(input[stbir__decode_order2])) * stbir__max_uint8_as_float_inverted;
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif
}